

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O3

void __thiscall
vkt::texture::SampleVerifier::getFilteredSample2D
          (SampleVerifier *this,IVec3 *texelBase,Vec2 *weights,int layer,int level,Vec4 *resultMin,
          Vec4 *resultMax)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  Interval *x;
  int compNdx;
  FloatFormat *this_00;
  float fVar9;
  Interval jWeightInterval;
  Interval iWeightInterval;
  Interval resultIntervals [4];
  Vec4 texelsMax [4];
  Vec4 texelsMin [4];
  ulong local_1d0;
  Interval local_1b0;
  Vec4 *local_198;
  Interval local_190;
  Interval local_178;
  undefined1 local_160 [16];
  undefined1 auStack_150 [8];
  Interval local_148 [4];
  Vec4 local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  Vec4 local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  Interval local_60;
  Interval local_48;
  
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8.m_data[0] = 0.0;
  local_a8.m_data[1] = 0.0;
  local_a8.m_data[2] = 0.0;
  local_a8.m_data[3] = 0.0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8.m_data[0] = 0.0;
  local_e8.m_data[1] = 0.0;
  local_e8.m_data[2] = 0.0;
  local_e8.m_data[3] = 0.0;
  lVar7 = 0;
  local_198 = resultMin;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    lVar4 = 0;
    bVar1 = true;
    do {
      bVar8 = bVar1;
      local_178.m_hasNaN = SUB41((int)lVar7,0);
      local_178._1_3_ = SUB43((int)lVar7,1);
      local_178._4_4_ = (int)lVar4;
      local_178.m_lo._0_4_ = 0;
      local_148[0].m_lo._0_4_ = 0;
      local_148[0].m_hasNaN = false;
      local_148[0]._1_7_ = 0;
      lVar6 = 0;
      do {
        (&local_e8)[-6].m_data[lVar6] =
             (float)(*(int *)(&local_178.m_hasNaN + lVar6 * 4) + texelBase->m_data[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      uVar3 = lVar4 << 5 | lVar7 << 4;
      fetchTexel(this,(IVec3 *)local_148,layer,level,VK_FILTER_LINEAR,
                 (Vec4 *)((long)local_a8.m_data + uVar3),(Vec4 *)((long)local_e8.m_data + uVar3));
      lVar4 = 1;
      bVar1 = false;
    } while (bVar8);
    lVar7 = 1;
    bVar1 = false;
  } while (bVar2);
  lVar7 = 8;
  do {
    auStack_150[lVar7] = 0;
    *(undefined8 *)(&local_148[0].m_hasNaN + lVar7) = 0x7ff0000000000000;
    *(undefined8 *)((long)&local_148[0].m_lo + lVar7) = 0xfff0000000000000;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x68);
  lVar7 = 8;
  do {
    auStack_150[lVar7] = 0;
    *(undefined8 *)(&local_148[0].m_hasNaN + lVar7) = 0;
    *(undefined8 *)((long)&local_148[0].m_lo + lVar7) = 0;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x68);
  this_00 = &this->m_filteringPrecision;
  local_1d0 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    fVar9 = weights->m_data[1];
    if (bVar2) {
      fVar9 = 1.0 - fVar9;
    }
    local_190.m_hasNaN = NAN(fVar9);
    local_190.m_lo = INFINITY;
    if (!local_190.m_hasNaN) {
      local_190.m_lo = (double)fVar9;
    }
    local_190.m_hi = -INFINITY;
    if (!local_190.m_hasNaN) {
      local_190.m_hi = (double)fVar9;
    }
    tcu::FloatFormat::roundOut(&local_178,this_00,&local_190,false);
    uVar3 = 0;
    bVar1 = true;
    do {
      bVar8 = bVar1;
      fVar9 = weights->m_data[0];
      if (bVar8) {
        fVar9 = 1.0 - fVar9;
      }
      local_1b0.m_hasNaN = NAN(fVar9);
      local_1b0.m_lo = INFINITY;
      if (!local_1b0.m_hasNaN) {
        local_1b0.m_lo = (double)fVar9;
      }
      local_1b0.m_hi = -INFINITY;
      if (!local_1b0.m_hasNaN) {
        local_1b0.m_hi = (double)fVar9;
      }
      tcu::operator*((Interval *)local_160,&local_178,&local_1b0);
      tcu::FloatFormat::roundOut(&local_190,this_00,(Interval *)local_160,false);
      x = local_148;
      lVar7 = 0;
      do {
        local_160[0] = false;
        unique0x100001b6 = SUB84((double)(&local_e8)[uVar3 | local_1d0].m_data[lVar7],0);
        local_160._8_8_ = (double)(&local_a8)[uVar3 | local_1d0].m_data[lVar7];
        unique0x100001ba =
             (int)((ulong)(double)(&local_e8)[uVar3 | local_1d0].m_data[lVar7] >> 0x20);
        tcu::operator*(&local_60,&local_190,(Interval *)local_160);
        tcu::operator+(&local_48,x,&local_60);
        tcu::FloatFormat::roundOut(&local_1b0,this_00,&local_48,false);
        x->m_hi = local_1b0.m_hi;
        *(ulong *)x = CONCAT71(local_1b0._1_7_,local_1b0.m_hasNaN);
        x->m_lo = local_1b0.m_lo;
        lVar7 = lVar7 + 1;
        x = x + 1;
      } while (lVar7 != 4);
      uVar3 = 1;
      bVar1 = false;
    } while (bVar8);
    local_1d0 = 2;
  } while (bVar2);
  pdVar5 = &local_148[0].m_hi;
  lVar7 = 0;
  do {
    local_198->m_data[lVar7] = (float)pdVar5[-1];
    resultMax->m_data[lVar7] = (float)*pdVar5;
    lVar7 = lVar7 + 1;
    pdVar5 = pdVar5 + 3;
  } while (lVar7 != 4);
  return;
}

Assistant:

void SampleVerifier::getFilteredSample2D (const IVec3&	texelBase,
										  const Vec2&	weights,
										  int			layer,
										  int			level,
										  Vec4&			resultMin,
										  Vec4&			resultMax) const
{
	Vec4 texelsMin[4];
	Vec4 texelsMax[4];

	for (int i = 0; i < 2; ++i)
	{
		for (int j = 0; j < 2; ++j)
		{
		    fetchTexel(texelBase + IVec3(i, j, 0), layer, level, VK_FILTER_LINEAR, texelsMin[2 * j + i], texelsMax[2 * j + i]);
		}
	}

	Interval resultIntervals[4];

	for (int ndx = 0; ndx < 4; ++ndx)
	{
		resultIntervals[ndx] = Interval(0.0);
	}

	for (int i = 0; i < 2; ++i)
	{
		const Interval iWeightInterval = m_filteringPrecision.roundOut(Interval(i == 0 ? 1.0f - weights[1] : weights[1]), false);

		for (int j = 0; j < 2; ++j)
		{
		    const Interval jWeightInterval = m_filteringPrecision.roundOut(iWeightInterval * Interval(j == 0 ? 1.0f - weights[0] : weights[0]), false);

			for (int compNdx = 0; compNdx < 4; ++compNdx)
			{
				const Interval texelInterval(false, texelsMin[2 * i + j][compNdx], texelsMax[2 * i + j][compNdx]);

				resultIntervals[compNdx] = m_filteringPrecision.roundOut(resultIntervals[compNdx] + jWeightInterval * texelInterval, false);
			}
		}
	}

	for (int compNdx = 0; compNdx < 4; ++compNdx)
	{
		resultMin[compNdx] = (float)resultIntervals[compNdx].lo();
		resultMax[compNdx] = (float)resultIntervals[compNdx].hi();
	}
}